

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O3

void __thiscall Type::GenPreParsing(Type *this,Output *out_cc,Env *env)

{
  int iVar1;
  char *pcVar2;
  
  if (this->incremental_input_ == true) {
    iVar1 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x10])(this);
    if ((char)iVar1 != '\0') {
      pcVar2 = Env::LValue(env,this->value_var_);
      Output::println(out_cc,"if ( ! %s )",pcVar2);
      out_cc->indent_ = out_cc->indent_ + 1;
      Output::println(out_cc,"{");
      (*(this->super_DataDepElement)._vptr_DataDepElement[0x17])(this,out_cc,env);
      Output::println(out_cc,"}");
      out_cc->indent_ = out_cc->indent_ + -1;
      goto LAB_001269d6;
    }
  }
  (*(this->super_DataDepElement)._vptr_DataDepElement[0x17])(this,out_cc,env);
LAB_001269d6:
  if (this->buffer_input_ == true) {
    GenBufferConfiguration(this,out_cc,env);
    return;
  }
  return;
}

Assistant:

void Type::GenPreParsing(Output* out_cc, Env* env)
	{
	if ( incremental_input() && IsPointerType() )
		{
		out_cc->println("if ( ! %s )", env->LValue(value_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		GenNewInstance(out_cc, env);
		out_cc->println("}");
		out_cc->dec_indent();
		}
	else
		GenNewInstance(out_cc, env);

	if ( buffer_input() )
		{
		GenBufferConfiguration(out_cc, env);
		}
	}